

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O3

void __thiscall sf::Font::cleanup(Font *this,EVP_PKEY_CTX *ctx)

{
  int *piVar1;
  pointer puVar2;
  pointer puVar3;
  
  piVar1 = this->m_refCount;
  if ((piVar1 != (int *)0x0) && (*piVar1 = *piVar1 + -1, *piVar1 == 0)) {
    operator_delete(piVar1,4);
    if (this->m_stroker != (void *)0x0) {
      FT_Stroker_Done();
    }
    if (this->m_face != (void *)0x0) {
      FT_Done_Face();
    }
    if (this->m_streamRec != (void *)0x0) {
      operator_delete(this->m_streamRec,0x50);
    }
    if (this->m_library != (void *)0x0) {
      FT_Done_FreeType();
    }
  }
  this->m_streamRec = (void *)0x0;
  this->m_stroker = (void *)0x0;
  this->m_library = (void *)0x0;
  this->m_face = (void *)0x0;
  this->m_refCount = (int *)0x0;
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_sf::Font::Page>,_std::_Select1st<std::pair<const_unsigned_int,_sf::Font::Page>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sf::Font::Page>_>_>
  ::clear(&(this->m_pages)._M_t);
  puVar2 = (this->m_pixelBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->m_pixelBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_pixelBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_pixelBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_pixelBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)puVar3 - (long)puVar2);
    return;
  }
  return;
}

Assistant:

void Font::cleanup()
{
    // Check if we must destroy the FreeType pointers
    if (m_refCount)
    {
        // Decrease the reference counter
        (*m_refCount)--;

        // Free the resources only if we are the last owner
        if (*m_refCount == 0)
        {
            // Delete the reference counter
            delete m_refCount;

            // Destroy the stroker
            if (m_stroker)
                FT_Stroker_Done(static_cast<FT_Stroker>(m_stroker));

            // Destroy the font face
            if (m_face)
                FT_Done_Face(static_cast<FT_Face>(m_face));

            // Destroy the stream rec instance, if any (must be done after FT_Done_Face!)
            if (m_streamRec)
                delete static_cast<FT_StreamRec*>(m_streamRec);

            // Close the library
            if (m_library)
                FT_Done_FreeType(static_cast<FT_Library>(m_library));
        }
    }

    // Reset members
    m_library   = NULL;
    m_face      = NULL;
    m_stroker   = NULL;
    m_streamRec = NULL;
    m_refCount  = NULL;
    m_pages.clear();
    std::vector<Uint8>().swap(m_pixelBuffer);
}